

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

Var Js::TaggedInt::ShiftLeft(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int nValue_00;
  uint32 nShift;
  int nValue;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  undefined8 local_10;
  
  iVar2 = ToInt32(aLeft);
  uVar3 = ToUInt32(aRight);
  nValue_00 = iVar2 << ((byte)uVar3 & 0x1f);
  bVar1 = IsOverflow(nValue_00);
  if (bVar1) {
    local_10 = JavascriptNumber::NewInlined((double)nValue_00,scriptContext);
  }
  else {
    local_10 = ToVarUnchecked(nValue_00);
  }
  return local_10;
}

Assistant:

Var TaggedInt::ShiftLeft(Var aLeft,Var aRight,ScriptContext* scriptContext)
    {
        //
        // Shifting an integer left will always remain an integer, but it may overflow the Int31
        // range. Therefore, we must call JavascriptNumber::ToVar() to check.
        //

        int nValue      = ToInt32(aLeft);
        uint32 nShift   = ToUInt32(aRight);

        return JavascriptNumber::ToVar(nValue << (nShift & 0x1F),scriptContext);
    }